

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall CompoundStmt::~CompoundStmt(CompoundStmt *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__CompoundStmt_00117c70;
  ppSVar1 = (this->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppSVar2 != ppSVar1; ppSVar2 = ppSVar2 + 1) {
    if (*ppSVar2 != (Stmt *)0x0) {
      (*((*ppSVar2)->super_Node)._vptr_Node[1])();
    }
  }
  ppSVar2 = (this->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar2 != (pointer)0x0) {
    operator_delete(ppSVar2,(long)(this->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar2)
    ;
    return;
  }
  return;
}

Assistant:

~CompoundStmt() {
    for (Stmt* s : stmts)
      delete s;
  }